

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O1

void __thiscall fineftp::Filesystem::FileStatus::FileStatus(FileStatus *this,string *path)

{
  pointer pcVar1;
  int iVar2;
  
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + path->_M_string_length)
  ;
  iVar2 = stat((path->_M_dataplus)._M_p,(stat *)&this->file_status_);
  this->is_ok_ = iVar2 == 0;
  return;
}

Assistant:

FileStatus::FileStatus(const std::string& path)
    : path_(path)
  {
#ifdef WIN32
    std::wstring w_path_ = StrConvert::Utf8ToWide(path);
    const int error_code = _wstat64(w_path_.c_str(), &file_status_);
#else // WIN32
    const int error_code = stat(path.c_str(), &file_status_);
#endif // WIN32
    is_ok_ = (error_code == 0);
  }